

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileColliderTests.cpp
# Opt level: O3

void __thiscall
solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test
::TestBody(StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test *this)

{
  FunctionMocker<std::optional<unsigned_int>_()> *this_00;
  _Optional_payload_base<unsigned_int> _Var1;
  ParamType *pPVar2;
  TypedExpectation<std::optional<unsigned_int>_()> *this_01;
  ActionInterface<std::optional<unsigned_int>_()> *impl;
  char *message;
  AssertHelper local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [16];
  _Manager_type local_40;
  MockSpec<std::optional<unsigned_int>_()> local_30;
  
  pPVar2 = testing::WithParamInterface<solitaire::colliders::UncoveredPileCardsPositionData>::
           GetParam();
  this_00 = &(this->super_StockPileColliderGetUncoveredCardsPositionTests).
             super_StockPileColliderTests.stockPileMock.gmock10_getSelectedCardIndex_17;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,
             &(this->super_StockPileColliderGetUncoveredCardsPositionTests).
              super_StockPileColliderTests.stockPileMock);
  local_30.function_mocker_ = this_00;
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<std::optional<unsigned_int>_()>::InternalExpectedAt
                      (&local_30,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/colliders/StockPileColliderTests.cpp"
                       ,0x75,"stockPileMock","getSelectedCardIndex()");
  _Var1 = (pPVar2->selectedCardIndex).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>;
  local_60.data_ = (AssertHelperData *)operator_new(8);
  (local_60.data_)->type = (Type)_Var1._M_payload;
  (local_60.data_)->field_0x4 = _Var1._M_engaged;
  *(int3 *)&(local_60.data_)->field_0x5 = _Var1._5_3_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::optional<unsigned_int>*>
            (&local_58,(optional<unsigned_int> *)local_60.data_);
  impl = (ActionInterface<std::optional<unsigned_int>_()> *)operator_new(0x18);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00320cb8;
  _Var1._M_payload = (_Storage<unsigned_int,_true>)(local_60.data_)->type;
  _Var1._M_engaged = (bool)(local_60.data_)->field_0x4;
  _Var1._5_3_ = *(undefined3 *)&(local_60.data_)->field_0x5;
  impl[1]._vptr_ActionInterface = (_func_int **)_Var1;
  impl[2]._vptr_ActionInterface = (_func_int **)_Var1;
  testing::Action<std::optional<unsigned_int>_()>::Action
            ((Action<std::optional<unsigned_int>_()> *)local_50,impl);
  testing::internal::TypedExpectation<std::optional<unsigned_int>_()>::WillOnce
            (this_01,(Action<std::optional<unsigned_int>_()> *)local_50);
  if (local_40 != (_Manager_type)0x0) {
    (*local_40)((_Any_data *)local_50,(_Any_data *)local_50,__destroy_functor);
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  local_30.function_mocker_ =
       (FunctionMocker<std::optional<unsigned_int>_()> *)
       StockPileCollider::getUncoveredCardsPosition
                 (&(this->super_StockPileColliderGetUncoveredCardsPositionTests).
                   super_StockPileColliderTests.collider);
  testing::internal::CmpHelperEQ<solitaire::geometry::Position,solitaire::geometry::Position>
            ((internal *)local_50,"collider.getUncoveredCardsPosition()",
             "uncoveredCardsPositionData.position",(Position *)&local_30,&pPVar2->position);
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_30);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_50._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/colliders/StockPileColliderTests.cpp"
               ,0x7b,message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((Position)local_30.function_mocker_ != (Position)0x0) {
      (**(code **)(*(long *)local_30.function_mocker_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_50 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._8_8_
                );
  }
  return;
}

Assistant:

TEST_P(StockPileColliderGetUncoveredCardsPositionTests, getUncoveredCardsPosition) {
    const auto& uncoveredCardsPositionData = GetParam();
    EXPECT_CALL(stockPileMock, getSelectedCardIndex())
        .WillOnce(Return(uncoveredCardsPositionData.selectedCardIndex));

    EXPECT_EQ(
        collider.getUncoveredCardsPosition(),
        uncoveredCardsPositionData.position
    );
}